

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O0

Vector * __thiscall Clusters::append_a_cluster(Clusters *this,unsigned_long sequence_id)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  Vector *this_00;
  long *in_RDI;
  Vector *new_vector;
  unsigned_long k_2;
  unsigned_long k_1;
  Vector **new_vectors;
  unsigned_long new_allocation;
  unsigned_long k;
  unsigned_long slot;
  void *in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  ulong local_40;
  ulong local_38;
  ulong local_20;
  ulong local_18;
  
  local_18 = 0;
  if (in_RDI[3] == 0) {
    local_18 = in_RDI[2];
    if (in_RDI[2] == in_RDI[1]) {
      if ((ulong)in_RDI[1] < 0x201) {
        in_stack_ffffffffffffff90 = (Vector *)0x80;
      }
      else {
        in_stack_ffffffffffffff90 = (Vector *)((ulong)in_RDI[1] >> 2);
      }
      uVar2 = (long)&in_stack_ffffffffffffff90->vData + in_RDI[1];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar4 = operator_new__(uVar3);
      for (local_38 = 0; local_38 < (ulong)in_RDI[1]; local_38 = local_38 + 1) {
        *(undefined8 *)((long)pvVar4 + local_38 * 8) = *(undefined8 *)(*in_RDI + local_38 * 8);
      }
      for (local_40 = in_RDI[1]; local_40 < uVar2; local_40 = local_40 + 1) {
        *(undefined8 *)((long)pvVar4 + local_40 * 8) = 0;
      }
      in_stack_ffffffffffffff88 = (void *)*in_RDI;
      if (in_stack_ffffffffffffff88 != (void *)0x0) {
        operator_delete__(in_stack_ffffffffffffff88);
      }
      in_RDI[1] = uVar2;
      *in_RDI = (long)pvVar4;
    }
  }
  else {
    for (local_20 = 0; local_20 < (ulong)in_RDI[1]; local_20 = local_20 + 1) {
      if (*(long *)(*in_RDI + local_20 * 8) == 0) {
        local_18 = local_20;
        break;
      }
      in_RDI[3] = in_RDI[3] + -1;
    }
  }
  this_00 = (Vector *)operator_new(0x18);
  Vector::Vector(this_00);
  *(Vector **)(*in_RDI + local_18 * 8) = this_00;
  Vector::appendValue(in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
  in_RDI[2] = in_RDI[2] + 1;
  return this_00;
}

Assistant:

Vector *append_a_cluster(unsigned long sequence_id) {
    /** allocate a new cluster and seed it with sequence sequence_id

     @param sequence_id

     return the new cluster vector
     */

    unsigned long slot = 0UL;

    if (unused > 0UL) {
      for (unsigned long k = 0UL; k < allocated_clusters; k++) {
        if (list_of_clusters[k] == NULL) {
          slot = k;
          break;
        }
        unused--;
      }
    } else {
      slot = cluster_count;
      if (cluster_count == allocated_clusters) {
        unsigned long new_allocation =
            allocated_clusters +
            (allocated_clusters > 512UL ? (allocated_clusters >> 2) : 128UL);
        Vector **new_vectors = new Vector *[new_allocation];

        for (unsigned long k = 0UL; k < allocated_clusters; k++) {
          new_vectors[k] = list_of_clusters[k];
        }
        for (unsigned long k = allocated_clusters; k < new_allocation; k++) {
          new_vectors[k] = NULL;
        }

        delete[] list_of_clusters;
        allocated_clusters = new_allocation;
        list_of_clusters = new_vectors;
      }
    }

    Vector *new_vector = (list_of_clusters[slot] = new Vector);
    new_vector->appendValue(sequence_id);
    cluster_count++;
    return new_vector;
  }